

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  byte bVar4;
  
  do {
    bVar1 = ((byte *)ptr1)[1];
    if (bVar1 < 0xdc) {
      uVar2 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar2 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr1);
        }
        else {
LAB_004e27db:
          uVar2 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar2 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)*ptr1 < 0xfe)) goto LAB_004e27db;
      uVar2 = 0;
    }
    switch(uVar2) {
    case 7:
      if (*ptr1 != *ptr2) {
        return 0;
      }
      ptr1 = (char *)((byte *)ptr1 + 1);
      ptr2 = (char *)((byte *)ptr2 + 1);
    case 6:
      if (*ptr1 != *ptr2) {
        return 0;
      }
      ptr1 = (char *)((byte *)ptr1 + 1);
      ptr2 = (char *)((byte *)ptr2 + 1);
    case 5:
      if (*ptr1 != *ptr2) {
        return 0;
      }
      if (((byte *)ptr1)[1] != ((byte *)ptr2)[1]) {
        return 0;
      }
      break;
    default:
      bVar1 = ((byte *)ptr2)[1];
      if (bVar1 < 0xdc) {
        bVar4 = 2;
        if (bVar1 - 0xd8 < 4) goto LAB_004e2890;
        if (bVar1 == 0) {
          bVar4 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr2) - 5;
          goto LAB_004e2890;
        }
      }
      else {
        if (bVar1 - 0xdc < 4) {
          bVar4 = 3;
          goto LAB_004e2890;
        }
        if ((bVar1 == 0xff) && (bVar4 = 0xfb, 0xfd < (byte)*ptr2)) goto LAB_004e2890;
      }
      bVar4 = 0x18;
LAB_004e2890:
      iVar3 = 1;
      if (bVar4 < 0x19) {
        iVar3 = *(int *)(&DAT_005da418 + (ulong)bVar4 * 4);
      }
      return iVar3;
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      if (*ptr2 != *ptr1) {
        return 0;
      }
      if (((byte *)ptr2)[1] != bVar1) {
        return 0;
      }
    }
    ptr2 = (char *)((byte *)ptr2 + 2);
    ptr1 = (char *)((byte *)ptr1 + 2);
  } while( true );
}

Assistant:

static
int PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}